

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O3

void __thiscall
PieceSquareTableInterpolating::Append
          (PieceSquareTableInterpolating *this,PieceSquareRawTableType *table,
          float fInterpolationFactor)

{
  pointer *ppPVar1;
  iterator __position;
  iterator __position_00;
  PieceSquareTableBase baseTable;
  float local_124;
  PieceSquareTableBase local_120;
  
  local_120._vptr_PieceSquareTableBase = (_func_int **)&PTR_InvertColor_001206e8;
  local_124 = fInterpolationFactor;
  memcpy(&local_120.m_SourceTable,table,0x100);
  __position._M_current =
       (this->m_SourceTables).
       super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_SourceTables).
      super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<PieceSquareTableBase,std::allocator<PieceSquareTableBase>>::
    _M_realloc_insert<PieceSquareTableBase_const&>
              ((vector<PieceSquareTableBase,std::allocator<PieceSquareTableBase>> *)
               &this->m_SourceTables,__position,&local_120);
  }
  else {
    (__position._M_current)->_vptr_PieceSquareTableBase = (_func_int **)&PTR_InvertColor_001206e8;
    memcpy(&(__position._M_current)->m_SourceTable,&local_120.m_SourceTable,0x100);
    ppPVar1 = &(this->m_SourceTables).
               super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  __position_00._M_current =
       (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
              ((vector<float,std::allocator<float>> *)&this->m_Phases,__position_00,&local_124);
  }
  else {
    *__position_00._M_current = fInterpolationFactor;
    (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void Append( const PieceSquareRawTableType &table,
                 const float fInterpolationFactor = 0.0f )
    {
        /* for now, we're order sensitive on this. */
        PieceSquareTableBase baseTable( table );
        m_SourceTables.push_back( baseTable );
        m_Phases.push_back( fInterpolationFactor );
    }